

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O2

void __thiscall leveldb::_Test_NoLogFiles::_Run(_Test_NoLogFiles *this)

{
  allocator local_1fa;
  allocator local_1f9;
  undefined1 local_1f8 [8];
  string local_1f0;
  string local_1d0;
  Tester local_1b0;
  
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0xce);
  std::__cxx11::string::string((string *)(local_1f8 + 0x28),"foo",&local_1f9);
  std::__cxx11::string::string((string *)(local_1f8 + 8),"bar",&local_1fa);
  RecoveryTest::Put((RecoveryTest *)local_1f8,(string *)this,(string *)(local_1f8 + 0x28));
  test::Tester::IsOk(&local_1b0,(Status *)local_1f8);
  Status::~Status((Status *)local_1f8);
  std::__cxx11::string::~string((string *)(local_1f8 + 8));
  std::__cxx11::string::~string((string *)(local_1f8 + 0x28));
  test::Tester::~Tester(&local_1b0);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0xcf);
  local_1f0._M_dataplus._M_p._0_4_ = 1;
  local_1d0._M_dataplus._M_p = (pointer)RecoveryTest::DeleteLogFiles(&this->super_RecoveryTest);
  test::Tester::IsEq<int,unsigned_long>
            (&local_1b0,(int *)(local_1f8 + 8),(unsigned_long *)(local_1f8 + 0x28));
  test::Tester::~Tester(&local_1b0);
  RecoveryTest::Open(&this->super_RecoveryTest,(Options *)0x0);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0xd1);
  std::__cxx11::string::string((string *)(local_1f8 + 8),"foo",(allocator *)local_1f8);
  RecoveryTest::Get((string *)(local_1f8 + 0x28),&this->super_RecoveryTest,(string *)(local_1f8 + 8)
                    ,(Snapshot *)0x0);
  test::Tester::IsEq<char[10],std::__cxx11::string>
            (&local_1b0,(char (*) [10])"NOT_FOUND",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1f8 + 0x28)
            );
  std::__cxx11::string::~string((string *)(local_1f8 + 0x28));
  std::__cxx11::string::~string((string *)(local_1f8 + 8));
  test::Tester::~Tester(&local_1b0);
  RecoveryTest::Open(&this->super_RecoveryTest,(Options *)0x0);
  test::Tester::Tester
            (&local_1b0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/recovery_test.cc"
             ,0xd3);
  std::__cxx11::string::string((string *)(local_1f8 + 8),"foo",(allocator *)local_1f8);
  RecoveryTest::Get((string *)(local_1f8 + 0x28),&this->super_RecoveryTest,(string *)(local_1f8 + 8)
                    ,(Snapshot *)0x0);
  test::Tester::IsEq<char[10],std::__cxx11::string>
            (&local_1b0,(char (*) [10])"NOT_FOUND",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_1f8 + 0x28)
            );
  std::__cxx11::string::~string((string *)(local_1f8 + 0x28));
  std::__cxx11::string::~string((string *)(local_1f8 + 8));
  test::Tester::~Tester(&local_1b0);
  return;
}

Assistant:

TEST(RecoveryTest, NoLogFiles) {
  ASSERT_OK(Put("foo", "bar"));
  ASSERT_EQ(1, DeleteLogFiles());
  Open();
  ASSERT_EQ("NOT_FOUND", Get("foo"));
  Open();
  ASSERT_EQ("NOT_FOUND", Get("foo"));
}